

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

void __thiscall DataSet::save(DataSet *this,string *filepath,WriteInfo *info)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  pointer pbVar4;
  ulong uVar5;
  ulong uVar6;
  Matrix<double> *this_00;
  uint row;
  ulong uVar7;
  uint col;
  ulong uVar8;
  double dVar9;
  ofstream file;
  Shape local_240;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)filepath,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    if (info->shape_skip == false) {
      local_240.n_row = (this->m_matrix).m_shape.n_row;
      local_240.n_col = (this->m_matrix).m_shape.n_col;
      local_240.is_diogonal = (this->m_matrix).m_shape.is_diogonal;
      poVar3 = operator<<((ostream *)&local_230,&local_240);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if ((info->header_skip == false) &&
       (pbVar4 = (this->m_labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       pbVar4 != (this->m_labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      uVar5 = 1;
      uVar8 = 0;
      do {
        uVar7 = uVar5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,pbVar4[uVar8]._M_dataplus._M_p,
                   pbVar4[uVar8]._M_string_length);
        pbVar4 = (this->m_labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(this->m_labels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5;
        if (uVar8 < uVar6 - 1) {
          local_240.n_row._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,(char *)&local_240,1);
          pbVar4 = (this->m_labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (long)(this->m_labels).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5;
        }
        uVar5 = (ulong)((int)uVar7 + 1);
        uVar8 = uVar7;
      } while (uVar7 < uVar6);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    uVar5._0_4_ = (this->m_matrix).m_shape.n_row;
    uVar5._4_4_ = (this->m_matrix).m_shape.n_col;
    if ((undefined4)uVar5 != 0) {
      this_00 = &this->m_matrix;
      row = 0;
      do {
        if (uVar5 >> 0x20 != 0) {
          col = 0;
          do {
            dVar9 = Matrix<double>::get(this_00,row,col);
            std::ostream::_M_insert<double>(dVar9);
            uVar2 = (this->m_matrix).m_shape.n_col;
            if (col < uVar2 - 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
              uVar2 = (this->m_matrix).m_shape.n_col;
            }
            col = col + 1;
          } while (col < uVar2);
        }
        cVar1 = (char)(ostream *)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        row = row + 1;
        uVar5._0_4_ = (this_00->m_shape).n_row;
        uVar5._4_4_ = (this_00->m_shape).n_col;
      } while (row < (uint)(undefined4)uVar5);
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving dataset]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void DataSet::save(const std::string& filepath, const WriteInfo& info) const{
    std::ofstream file(filepath);
    
    if(!file){
        std::cout<<"ERROR [saving dataset]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        file<<m_matrix.shape()<<std::endl;
    }
    if(!info.header_skip && !m_labels.empty()){
        for(unsigned i=0;i<m_labels.size();++i){
            file<<m_labels[i];
            if(i<m_labels.size()-1) file<<',';
        }   file<<std::endl;
    }

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col;++j){
            file<<m_matrix.get(i,j);
            if(j<m_matrix.shape().n_col-1) file<<", ";
        }   file<<std::endl;
    }

    file.close();
}